

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifsdm(bifcxdef *ctx,int argc)

{
  prpnum prop;
  vocddef *what;
  long lVar1;
  voccxdef *ctx_00;
  long in_RDI;
  voccxdef *voc;
  runsdef val;
  objnum func;
  int in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  undefined2 in_stack_ffffffffffffffd6;
  char cVar2;
  undefined2 in_stack_fffffffffffffff0;
  
  what = *(vocddef **)(*(long *)(in_RDI + 8) + 0x70);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  if (*(char *)(lVar1 + -0x10) != '\n') {
    *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
    runsign((runcxdef *)
            CONCAT26(in_stack_ffffffffffffffd6,
                     CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
            in_stack_ffffffffffffffcc);
  }
  prop = *(prpnum *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
  lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
  *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
  ctx_00 = *(voccxdef **)(lVar1 + -0x10);
  cVar2 = (char)ctx_00;
  if ((cVar2 != '\a') && (cVar2 != '\x03')) {
    vocsetfd(ctx_00,what,0,prop,in_stack_ffffffffffffffd0,
             (runsdef *)CONCAT44(in_stack_ffffffffffffffcc,0x406),
             CONCAT22(prop,in_stack_fffffffffffffff0));
    return;
  }
  *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
  runsign((runcxdef *)(ulong)CONCAT24(prop,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
}

Assistant:

void bifsdm(bifcxdef *ctx, int argc)
{
    objnum    func;
    runsdef   val;
    voccxdef *voc = ctx->bifcxrun->runcxvoc;
    
    bifcntargs(ctx, 2, argc);            /* check for proper argument count */
    func = runpopfn(ctx->bifcxrun);
    runpop(ctx->bifcxrun, &val);
    
    /* limitation:  don't allow string or list for value */
    if (val.runstyp == DAT_LIST || val.runstyp == DAT_SSTRING)
        runsig(ctx->bifcxrun, ERR_FUSEVAL);
    
    vocsetfd(voc, voc->voccxdmn, func, (prpnum)0, 0,
             &val, ERR_MANYDMN);
}